

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

string * __thiscall
ShellPathNode::Evaluate
          (string *__return_storage_ptr__,ShellPathNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  bool bVar1;
  long *plVar2;
  cmState *pcVar3;
  cmOutputConverter converter;
  undefined1 local_80 [32];
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = cmsys::SystemTools::FileIsFullPath
                    ((parameters->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start);
  if (bVar1) {
    cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)local_80,context->LG);
    cmOutputConverter::cmOutputConverter((cmOutputConverter *)&local_60,(cmStateSnapshot *)local_80)
    ;
    cmOutputConverter::ConvertDirectorySeparatorsForShell
              (__return_storage_ptr__,(cmOutputConverter *)&local_60,
               (parameters->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start);
  }
  else {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_60,content);
    std::operator+(&local_40,"\"",
                   (parameters->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
    pcVar3 = (cmState *)(plVar2 + 2);
    if ((cmState *)*plVar2 == pcVar3) {
      local_80._16_8_ = *(undefined8 *)&(pcVar3->PropertyDefinitions)._M_t._M_impl;
      local_80._24_8_ = plVar2[3];
      local_80._0_8_ = (cmState *)(local_80 + 0x10);
    }
    else {
      local_80._16_8_ = *(undefined8 *)&(pcVar3->PropertyDefinitions)._M_t._M_impl;
      local_80._0_8_ = (cmState *)*plVar2;
    }
    local_80._8_8_ = plVar2[1];
    *plVar2 = (long)pcVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    reportError(context,&local_60,(string *)local_80);
    if ((cmState *)local_80._0_8_ != (cmState *)(local_80 + 0x10)) {
      operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string>& parameters,
                       cmGeneratorExpressionContext* context,
                       const GeneratorExpressionContent* content,
                       cmGeneratorExpressionDAGChecker* /*dagChecker*/) const
    CM_OVERRIDE
  {
    if (!cmSystemTools::FileIsFullPath(parameters.front())) {
      reportError(context, content->GetOriginalExpression(),
                  "\"" + parameters.front() + "\" is not an absolute path.");
      return std::string();
    }
    cmOutputConverter converter(context->LG->GetStateSnapshot());
    return converter.ConvertDirectorySeparatorsForShell(parameters.front());
  }